

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cast.h
# Opt level: O1

bool __thiscall
pybind11::detail::
argument_loader<pybind11::detail::value_and_holder&,std::vector<unsigned_int,std::allocator<unsigned_int>>,std::vector<float,std::allocator<float>>,std::vector<float,std::allocator<float>>,double>
::load_impl_sequence<0ul,1ul,2ul,3ul,4ul>
          (argument_loader<pybind11::detail::value_and_holder&,std::vector<unsigned_int,std::allocator<unsigned_int>>,std::vector<float,std::allocator<float>>,std::vector<float,std::allocator<float>>,double>
           *this,long call)

{
  char *pcVar1;
  uint uVar2;
  undefined8 *puVar3;
  long lVar4;
  bool bVar5;
  char local_14 [4];
  
  puVar3 = *(undefined8 **)(call + 8);
  uVar2 = **(uint **)(call + 0x20);
  *(undefined8 *)(this + 0x50) = *puVar3;
  list_caster<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_unsigned_int>::load
            ((list_caster<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_unsigned_int> *)
             (this + 0x38),(PyObject *)puVar3[1],SUB41((uVar2 & 2) >> 1,0));
  list_caster<std::vector<float,_std::allocator<float>_>,_float>::load
            ((list_caster<std::vector<float,_std::allocator<float>_>,_float> *)(this + 0x20),
             *(PyObject **)(*(long *)(call + 8) + 0x10),SUB41((**(uint **)(call + 0x20) & 4) >> 2,0)
            );
  list_caster<std::vector<float,_std::allocator<float>_>,_float>::load
            ((list_caster<std::vector<float,_std::allocator<float>_>,_float> *)(this + 8),
             *(PyObject **)(*(long *)(call + 8) + 0x18),SUB41((**(uint **)(call + 0x20) & 8) >> 3,0)
            );
  type_caster<double,_void>::load
            ((type_caster<double,_void> *)this,*(PyObject **)(*(long *)(call + 8) + 0x20),
             SUB41((**(uint **)(call + 0x20) & 0x10) >> 4,0));
  lVar4 = 0;
  do {
    bVar5 = lVar4 == 4;
    if (bVar5) {
      return bVar5;
    }
    pcVar1 = local_14 + lVar4;
    lVar4 = lVar4 + 1;
  } while (*pcVar1 != '\0');
  return bVar5;
}

Assistant:

bool load_impl_sequence(function_call &call, index_sequence<Is...>) {
        for (bool r : {std::get<Is>(argcasters).load(call.args[Is], call.args_convert[Is])...})
            if (!r)
                return false;
        return true;
    }